

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ArrayXd __thiscall ChebTools::ChebyshevExpansion::to_monomial_increasing(ChebyshevExpansion *this)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Index extraout_RDX;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  long index;
  ArrayXd AVar3;
  ArrayXd c;
  void *local_a8 [2];
  Index local_98 [7];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>
  local_60;
  
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&c,in_RSI);
  local_98[0] = c.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<long>
            ((Array<double,__1,_1,_0,__1,_1> *)this,local_98);
  Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)this);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&c,0);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)this,0);
  *pSVar2 = SVar1;
  for (index = 1;
      index < c.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      index = index + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&c,index);
    get_monomial_from_Cheb_basis((int)(StorageBaseType *)local_a8);
    Eigen::operator*(&local_60,pSVar2,(StorageBaseType *)local_a8);
    Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)local_98,(DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)this,
               (int)index + 1);
    Eigen::ArrayBase<Eigen::Block<Eigen::Array<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((ArrayBase<Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>,_1,1,false>> *)local_98,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                *)&local_60);
    free(local_a8[0]);
  }
  free(c.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  AVar3.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  AVar3.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ArrayXd)AVar3.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::ArrayXd ChebyshevExpansion::to_monomial_increasing() const {
        Eigen::ArrayXd c = coef();
        Eigen::Index N = c.size() - 1; // N is the degree of A
        Eigen::ArrayXd out(N+1); out.setZero();
        out[0] = c[0];
        for (auto i = 1; i <= N; ++i){
            out.head(i+1) += c(i)*get_monomial_from_Cheb_basis(i);
        }
        return out;
    }